

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceField.cpp
# Opt level: O2

void __thiscall OpenMD::ForceField::ForceField(ForceField *this,string *ffName)

{
  ForceFieldOptions *this_00;
  _Rb_tree_header *p_Var1;
  SectionParserContextList *pSVar2;
  SectionParserManager *this_01;
  OptionSectionParser *this_02;
  SectionParser *pSVar3;
  LennardJonesAtomTypesSectionParser *this_03;
  ChargeAtomTypesSectionParser *this_04;
  FluctuatingChargeAtomTypesSectionParser *this_05;
  GayBerneAtomTypesSectionParser *this_06;
  EAMAtomTypesSectionParser *this_07;
  SCAtomTypesSectionParser *this_08;
  UFFAtomTypesSectionParser *this_09;
  StickyAtomTypesSectionParser *this_10;
  StickyPowerAtomTypesSectionParser *this_11;
  BondTypesSectionParser *this_12;
  BendTypesSectionParser *this_13;
  TorsionTypesSectionParser *this_14;
  NonBondedInteractionsSectionParser *this_15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this->_vptr_ForceField = (_func_int **)&PTR__ForceField_002bca48;
  (this->atomTypeCont_).index_ = 0;
  p_Var1 = &(this->atomTypeCont_).data_._M_t._M_impl.super__Rb_tree_header;
  (this->atomTypeCont_).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->atomTypeCont_).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->atomTypeCont_).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->atomTypeCont_).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->atomTypeCont_).data_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->bondTypeCont_).index_ = 0;
  p_Var1 = &(this->bondTypeCont_).data_._M_t._M_impl.super__Rb_tree_header;
  (this->bondTypeCont_).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->bondTypeCont_).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->bondTypeCont_).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->bondTypeCont_).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->bondTypeCont_).data_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->bendTypeCont_).index_ = 0;
  p_Var1 = &(this->bendTypeCont_).data_._M_t._M_impl.super__Rb_tree_header;
  (this->bendTypeCont_).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->bendTypeCont_).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->bendTypeCont_).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->bendTypeCont_).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->bendTypeCont_).data_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->torsionTypeCont_).index_ = 0;
  p_Var1 = &(this->torsionTypeCont_).data_._M_t._M_impl.super__Rb_tree_header;
  (this->torsionTypeCont_).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->torsionTypeCont_).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->torsionTypeCont_).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->torsionTypeCont_).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->torsionTypeCont_).data_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->inversionTypeCont_).index_ = 0;
  p_Var1 = &(this->inversionTypeCont_).data_._M_t._M_impl.super__Rb_tree_header;
  (this->inversionTypeCont_).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->inversionTypeCont_).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->inversionTypeCont_).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->inversionTypeCont_).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->inversionTypeCont_).data_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->nonBondedInteractionTypeCont_).index_ = 0;
  (this->nonBondedInteractionTypeCont_).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_color
       = _S_red;
  (this->nonBondedInteractionTypeCont_).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
       = (_Base_ptr)0x0;
  p_Var1 = &(this->nonBondedInteractionTypeCont_).data_._M_t._M_impl.super__Rb_tree_header;
  (this->nonBondedInteractionTypeCont_).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->nonBondedInteractionTypeCont_).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       = &p_Var1->_M_header;
  (this->nonBondedInteractionTypeCont_).data_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_00 = &this->forceFieldOptions_;
  ForceFieldOptions::ForceFieldOptions(this_00);
  (this->atypeIdentToName)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->atypeIdentToName)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->atypeIdentToName)._M_t._M_impl.super__Rb_tree_header;
  (this->atypeIdentToName)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->atypeIdentToName)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->atypeIdentToName)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->spMan_).beginPriority_ = 0;
  (this->spMan_).priorityDifference_ = 100;
  pSVar2 = &(this->spMan_).sectionParsers_;
  (this->spMan_).sectionParsers_.
  super__List_base<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)pSVar2;
  (this->spMan_).sectionParsers_.
  super__List_base<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pSVar2;
  (this->spMan_).sectionParsers_.
  super__List_base<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>.
  _M_impl._M_node._M_size = 0;
  (this->ffPath_)._M_dataplus._M_p = (pointer)&(this->ffPath_).field_2;
  (this->ffPath_)._M_string_length = 0;
  this_01 = &this->spMan_;
  (this->ffPath_).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->wildCardAtomTypeName_,"X",(allocator<char> *)&local_50);
  (this->forceFieldFileName_)._M_dataplus._M_p = (pointer)&(this->forceFieldFileName_).field_2;
  (this->forceFieldFileName_)._M_string_length = 0;
  (this->forceFieldFileName_).field_2._M_local_buf[0] = '\0';
  getenv("FORCE_PARAM_PATH");
  std::__cxx11::string::assign((char *)&this->ffPath_);
  std::operator+(&local_50,ffName,".frc");
  std::__cxx11::string::_M_assign((string *)&this->forceFieldFileName_);
  std::__cxx11::string::~string((string *)&local_50);
  this_02 = (OptionSectionParser *)operator_new(0x30);
  OptionSectionParser::OptionSectionParser(this_02,this_00);
  SectionParserManager::push_back(this_01,(SectionParser *)this_02);
  pSVar3 = (SectionParser *)operator_new(0x28);
  BaseAtomTypesSectionParser::BaseAtomTypesSectionParser((BaseAtomTypesSectionParser *)pSVar3);
  SectionParserManager::push_back(this_01,pSVar3);
  pSVar3 = (SectionParser *)operator_new(0x28);
  DirectionalAtomTypesSectionParser::DirectionalAtomTypesSectionParser
            ((DirectionalAtomTypesSectionParser *)pSVar3,this_00);
  SectionParserManager::push_back(this_01,pSVar3);
  pSVar3 = (SectionParser *)operator_new(0x28);
  AtomTypesSectionParser::AtomTypesSectionParser((AtomTypesSectionParser *)pSVar3);
  SectionParserManager::push_back(this_01,pSVar3);
  this_03 = (LennardJonesAtomTypesSectionParser *)operator_new(0x30);
  LennardJonesAtomTypesSectionParser::LennardJonesAtomTypesSectionParser(this_03,this_00);
  SectionParserManager::push_back(this_01,(SectionParser *)this_03);
  this_04 = (ChargeAtomTypesSectionParser *)operator_new(0x30);
  ChargeAtomTypesSectionParser::ChargeAtomTypesSectionParser(this_04,this_00);
  SectionParserManager::push_back(this_01,(SectionParser *)this_04);
  pSVar3 = (SectionParser *)operator_new(0x28);
  MultipoleAtomTypesSectionParser::MultipoleAtomTypesSectionParser
            ((MultipoleAtomTypesSectionParser *)pSVar3,this_00);
  SectionParserManager::push_back(this_01,pSVar3);
  this_05 = (FluctuatingChargeAtomTypesSectionParser *)operator_new(0x80);
  FluctuatingChargeAtomTypesSectionParser::FluctuatingChargeAtomTypesSectionParser(this_05,this_00);
  SectionParserManager::push_back(this_01,(SectionParser *)this_05);
  pSVar3 = (SectionParser *)operator_new(0x28);
  PolarizableAtomTypesSectionParser::PolarizableAtomTypesSectionParser
            ((PolarizableAtomTypesSectionParser *)pSVar3,this_00);
  SectionParserManager::push_back(this_01,pSVar3);
  this_06 = (GayBerneAtomTypesSectionParser *)operator_new(0x30);
  GayBerneAtomTypesSectionParser::GayBerneAtomTypesSectionParser(this_06,this_00);
  SectionParserManager::push_back(this_01,(SectionParser *)this_06);
  this_07 = (EAMAtomTypesSectionParser *)operator_new(0x40);
  EAMAtomTypesSectionParser::EAMAtomTypesSectionParser(this_07,this_00);
  SectionParserManager::push_back(this_01,(SectionParser *)this_07);
  this_08 = (SCAtomTypesSectionParser *)operator_new(0x30);
  SCAtomTypesSectionParser::SCAtomTypesSectionParser(this_08,this_00);
  SectionParserManager::push_back(this_01,(SectionParser *)this_08);
  this_09 = (UFFAtomTypesSectionParser *)operator_new(0x30);
  UFFAtomTypesSectionParser::UFFAtomTypesSectionParser(this_09,this_00);
  SectionParserManager::push_back(this_01,(SectionParser *)this_09);
  pSVar3 = (SectionParser *)operator_new(0x28);
  ShapeAtomTypesSectionParser::ShapeAtomTypesSectionParser
            ((ShapeAtomTypesSectionParser *)pSVar3,this_00);
  SectionParserManager::push_back(this_01,pSVar3);
  this_10 = (StickyAtomTypesSectionParser *)operator_new(0x30);
  StickyAtomTypesSectionParser::StickyAtomTypesSectionParser(this_10,this_00);
  SectionParserManager::push_back(this_01,(SectionParser *)this_10);
  this_11 = (StickyPowerAtomTypesSectionParser *)operator_new(0x30);
  StickyPowerAtomTypesSectionParser::StickyPowerAtomTypesSectionParser(this_11,this_00);
  SectionParserManager::push_back(this_01,(SectionParser *)this_11);
  this_12 = (BondTypesSectionParser *)operator_new(0x30);
  BondTypesSectionParser::BondTypesSectionParser(this_12,this_00);
  SectionParserManager::push_back(this_01,(SectionParser *)this_12);
  this_13 = (BendTypesSectionParser *)operator_new(0x30);
  BendTypesSectionParser::BendTypesSectionParser(this_13,this_00);
  SectionParserManager::push_back(this_01,(SectionParser *)this_13);
  this_14 = (TorsionTypesSectionParser *)operator_new(0x30);
  TorsionTypesSectionParser::TorsionTypesSectionParser(this_14,this_00);
  SectionParserManager::push_back(this_01,(SectionParser *)this_14);
  pSVar3 = (SectionParser *)operator_new(0x28);
  InversionTypesSectionParser::InversionTypesSectionParser
            ((InversionTypesSectionParser *)pSVar3,this_00);
  SectionParserManager::push_back(this_01,pSVar3);
  this_15 = (NonBondedInteractionsSectionParser *)operator_new(0x78);
  NonBondedInteractionsSectionParser::NonBondedInteractionsSectionParser(this_15,this_00);
  SectionParserManager::push_back(this_01,(SectionParser *)this_15);
  return;
}

Assistant:

ForceField::ForceField(std::string ffName) : wildCardAtomTypeName_("X") {
    char* tempPath;
    tempPath = getenv("FORCE_PARAM_PATH");

    if (tempPath == NULL) {
      // convert a macro from compiler to a string in c++
      STR_DEFINE(ffPath_, FRC_PATH);
    } else {
      ffPath_ = tempPath;
    }

    setForceFieldFileName(ffName + ".frc");

    /**
     * The order of adding section parsers is important.
     *
     * OptionSectionParser must come first to set options for other
     * parsers
     *
     * DirectionalAtomTypesSectionParser should be added before
     * AtomTypesSectionParser, and these two section parsers will
     * actually create "real" AtomTypes (AtomTypesSectionParser will
     * create AtomType and DirectionalAtomTypesSectionParser will
     * create DirectionalAtomType, which is a subclass of AtomType and
     * should come first).
     *
     * Other AtomTypes Section Parsers will not create the "real"
     * AtomType, they only add and set some attributes of the AtomType
     * (via the Adapters). Thus ordering of these is not important.
     * AtomTypesSectionParser should be added before other atom type
     *
     * The order of BondTypesSectionParser, BendTypesSectionParser and
     * TorsionTypesSectionParser, etc. are not important.
     */

    spMan_.push_back(new OptionSectionParser(forceFieldOptions_));
    spMan_.push_back(new BaseAtomTypesSectionParser());
    spMan_.push_back(new DirectionalAtomTypesSectionParser(forceFieldOptions_));
    spMan_.push_back(new AtomTypesSectionParser());

    spMan_.push_back(
        new LennardJonesAtomTypesSectionParser(forceFieldOptions_));
    spMan_.push_back(new ChargeAtomTypesSectionParser(forceFieldOptions_));
    spMan_.push_back(new MultipoleAtomTypesSectionParser(forceFieldOptions_));
    spMan_.push_back(
        new FluctuatingChargeAtomTypesSectionParser(forceFieldOptions_));
    spMan_.push_back(new PolarizableAtomTypesSectionParser(forceFieldOptions_));
    spMan_.push_back(new GayBerneAtomTypesSectionParser(forceFieldOptions_));
    spMan_.push_back(new EAMAtomTypesSectionParser(forceFieldOptions_));
    spMan_.push_back(new SCAtomTypesSectionParser(forceFieldOptions_));
    spMan_.push_back(new UFFAtomTypesSectionParser(forceFieldOptions_));
    spMan_.push_back(new ShapeAtomTypesSectionParser(forceFieldOptions_));
    spMan_.push_back(new StickyAtomTypesSectionParser(forceFieldOptions_));
    spMan_.push_back(new StickyPowerAtomTypesSectionParser(forceFieldOptions_));

    spMan_.push_back(new BondTypesSectionParser(forceFieldOptions_));
    spMan_.push_back(new BendTypesSectionParser(forceFieldOptions_));
    spMan_.push_back(new TorsionTypesSectionParser(forceFieldOptions_));
    spMan_.push_back(new InversionTypesSectionParser(forceFieldOptions_));

    spMan_.push_back(
        new NonBondedInteractionsSectionParser(forceFieldOptions_));
  }